

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O1

UChar32 __thiscall icu_63::anon_unknown_16::UTF8NFDIterator::nextRawCodePoint(UTF8NFDIterator *this)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  uint8_t *puVar4;
  UChar32 UVar5;
  uint uVar6;
  byte bVar7;
  long lVar8;
  int iVar9;
  
  lVar8 = (long)this->pos;
  iVar3 = this->length;
  UVar5 = -1;
  if ((this->pos != iVar3) && ((puVar4 = this->s, -1 < iVar3 || (puVar4[lVar8] != '\0')))) {
    lVar1 = lVar8 + 1;
    this->pos = (int)lVar1;
    bVar2 = puVar4[lVar8];
    uVar6 = (uint)bVar2;
    if (-1 < (char)bVar2) {
      return uVar6;
    }
    UVar5 = 0xfffd;
    if ((int)lVar1 != iVar3) {
      if (bVar2 < 0xe0) {
        if (bVar2 < 0xc2) {
          return 0xfffd;
        }
        uVar6 = uVar6 & 0x1f;
      }
      else {
        if (bVar2 < 0xf0) {
          uVar6 = uVar6 & 0xf;
          if (((byte)" 000000000000\x1000"[uVar6] >> (puVar4[lVar1] >> 5) & 1) == 0) {
            return 0xfffd;
          }
          bVar7 = puVar4[lVar1] & 0x3f;
        }
        else {
          if (0xf4 < bVar2) {
            return 0xfffd;
          }
          bVar2 = puVar4[lVar1];
          if (((uint)(int)""[bVar2 >> 4] >> (uVar6 - 0xf0 & 0x1f) & 1) == 0) {
            return 0xfffd;
          }
          iVar9 = (int)(lVar8 + 2);
          this->pos = iVar9;
          if (iVar9 == iVar3) {
            return 0xfffd;
          }
          bVar7 = puVar4[lVar8 + 2] + 0x80;
          if (0x3f < bVar7) {
            return 0xfffd;
          }
          uVar6 = bVar2 & 0x3f | (uVar6 - 0xf0) * 0x40;
        }
        iVar9 = this->pos + 1;
        this->pos = iVar9;
        if (iVar9 == iVar3) {
          return 0xfffd;
        }
        uVar6 = (uint)bVar7 | uVar6 << 6;
      }
      bVar2 = puVar4[this->pos];
      if ((byte)(bVar2 ^ 0x80) < 0x40) {
        this->pos = this->pos + 1;
        return uVar6 << 6 | bVar2 ^ 0x80;
      }
    }
  }
  return UVar5;
}

Assistant:

virtual UChar32 nextRawCodePoint() {
        if(pos == length || (s[pos] == 0 && length < 0)) { return U_SENTINEL; }
        UChar32 c;
        U8_NEXT_OR_FFFD(s, pos, length, c);
        return c;
    }